

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

bool __thiscall duckdb::WindowHashGroup::TryNextTask(WindowHashGroup *this,TaskPtr *task)

{
  WindowGroupStage WVar1;
  reference pvVar2;
  
  if (this->next_task <
      (ulong)(((long)(this->tasks).
                     super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>
                     .
                     super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->tasks).
                     super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>
                     .
                     super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    pvVar2 = vector<duckdb::WindowSourceTask,_true>::operator[](&this->tasks,this->next_task);
    task->ptr = pvVar2;
    WVar1 = (this->stage)._M_i;
    optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(task);
    if (task->ptr->stage == WVar1) {
      this->next_task = this->next_task + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool TryNextTask(TaskPtr &task) {
		if (next_task >= tasks.size()) {
			return false;
		}
		task = tasks[next_task];
		auto group_stage = GetStage();
		if (task->stage == group_stage) {
			++next_task;
			return true;
		}

		return false;
	}